

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_dpb.c
# Opt level: O0

void sliding_window_memory_management(H264_DpbBuf_t *p_Dpb)

{
  int local_1c;
  uint local_14;
  RK_U32 i;
  H264_DpbBuf_t *p_Dpb_local;
  
  if (p_Dpb->num_ref_frames < 1) {
    local_1c = 1;
  }
  else {
    local_1c = p_Dpb->num_ref_frames;
  }
  if (p_Dpb->ref_frames_in_buffer == local_1c - p_Dpb->ltref_frames_in_buffer) {
    for (local_14 = 0; local_14 < p_Dpb->used_size; local_14 = local_14 + 1) {
      if ((p_Dpb->fs[local_14]->is_reference != 0) && (p_Dpb->fs[local_14]->is_long_term == 0)) {
        unmark_for_reference(p_Dpb->p_Vid->p_Dec,p_Dpb->fs[local_14]);
        update_ref_list(p_Dpb);
        return;
      }
    }
  }
  return;
}

Assistant:

static void sliding_window_memory_management(H264_DpbBuf_t *p_Dpb)
{
    RK_U32 i = 0;

    // if this is a reference pic with sliding window, unmark first ref frame
    if (p_Dpb->ref_frames_in_buffer == MPP_MAX(1, p_Dpb->num_ref_frames) - p_Dpb->ltref_frames_in_buffer) {
        for (i = 0; i < p_Dpb->used_size; i++) {
            if (p_Dpb->fs[i]->is_reference && (!(p_Dpb->fs[i]->is_long_term))) {
                unmark_for_reference(p_Dpb->p_Vid->p_Dec, p_Dpb->fs[i]);
                update_ref_list(p_Dpb);
                break;
            }
        }
    }
}